

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

FieldDescriptorProto *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::FieldDescriptorProto>(Arena *arena)

{
  FieldDescriptorProto *this;
  
  if (arena == (Arena *)0x0) {
    this = (FieldDescriptorProto *)operator_new(0x60);
    FieldDescriptorProto::FieldDescriptorProto(this,(Arena *)0x0);
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      OnArenaAllocation(arena,(type_info *)&FieldDescriptorProto::typeinfo,0x60);
    }
    this = (FieldDescriptorProto *)AllocateAlignedNoHook(arena,0x60);
    FieldDescriptorProto::FieldDescriptorProto(this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NOINLINE PROTOBUF_NAMESPACE_ID::FieldDescriptorProto* Arena::CreateMaybeMessage< PROTOBUF_NAMESPACE_ID::FieldDescriptorProto >(Arena* arena) {
  return Arena::CreateMessageInternal< PROTOBUF_NAMESPACE_ID::FieldDescriptorProto >(arena);
}